

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istream.cc
# Opt level: O3

Offset __thiscall
wabt::interp::Istream::Trace(Istream *this,Stream *stream,Offset offset,TraceSource *source)

{
  long *plVar1;
  char *format;
  char *pcVar2;
  Instr instr;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  Instr local_e8;
  float local_cc;
  long *local_c8 [2];
  long local_b8 [2];
  Info local_a8;
  char *local_60;
  Offset local_54;
  long *local_50 [2];
  long local_40 [2];
  
  local_54 = offset;
  Read(&local_e8,this,&local_54);
  (*source->_vptr_TraceSource[2])(local_c8,source,(ulong)offset);
  plVar1 = local_c8[0];
  Opcode::GetInfo(&local_a8,&local_e8.op);
  Stream::Writef(stream,"%s| %s",plVar1,local_a8.name);
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  switch(local_e8.kind) {
  case Imm_0_Op_0:
    Stream::Writef(stream,"\n");
    break;
  case Imm_0_Op_1:
    (*source->_vptr_TraceSource[3])(&local_a8,source,1);
    Stream::Writef(stream," %s\n",local_a8.name);
    goto LAB_00169f11;
  case Imm_0_Op_2:
    (*source->_vptr_TraceSource[3])(&local_a8,source,2);
    pcVar2 = local_a8.name;
    (*source->_vptr_TraceSource[3])(local_c8,source,1);
    Stream::Writef(stream," %s, %s\n",pcVar2,local_c8[0]);
    goto LAB_00169ef6;
  case Imm_0_Op_3:
    (*source->_vptr_TraceSource[3])(&local_a8,source,3);
    pcVar2 = local_a8.name;
    (*source->_vptr_TraceSource[3])(local_c8,source,2);
    plVar1 = local_c8[0];
    (*source->_vptr_TraceSource[3])(local_50,source,1);
    Stream::Writef(stream," %s, %s, %s\n",pcVar2,plVar1,local_50[0]);
    goto LAB_00169da8;
  case Imm_Jump_Op_0:
    pcVar2 = " @%u\n";
    goto LAB_00169c1c;
  case Imm_Jump_Op_1:
    (*source->_vptr_TraceSource[3])(&local_a8,source,1);
    pcVar2 = " @%u, %s\n";
    goto LAB_00169e06;
  case Imm_Index_Op_0:
  case Imm_Index_Op_N:
    pcVar2 = " $%u\n";
    goto LAB_00169c1c;
  case Imm_Index_Op_1:
    (*source->_vptr_TraceSource[3])(&local_a8,source,1);
    pcVar2 = " $%u, %s\n";
LAB_00169e06:
    Stream::Writef(stream,pcVar2,(ulong)local_e8.field_2.imm_u32,local_a8.name);
    goto LAB_00169f11;
  case Imm_Index_Op_2:
    (*source->_vptr_TraceSource[3])(&local_a8,source,2);
    pcVar2 = local_a8.name;
    (*source->_vptr_TraceSource[3])(local_c8,source,1);
    Stream::Writef(stream," $%u, %s, %s\n",(ulong)local_e8.field_2.imm_u32,pcVar2,local_c8[0]);
    goto LAB_00169ef6;
  case Imm_Index_Op_3:
    local_cc = (float)local_e8.field_2.imm_u32;
    (*source->_vptr_TraceSource[3])(&local_a8,source,3);
    pcVar2 = local_a8.name;
    (*source->_vptr_TraceSource[3])(local_c8,source,2);
    plVar1 = local_c8[0];
    uVar5 = CONCAT44(local_e8.field_2._12_4_,local_e8.field_2._8_4_);
    uVar4 = CONCAT44(local_e8.kind,local_e8.op.enum_);
    (*source->_vptr_TraceSource[3])(local_50,source,1);
    Stream::Writef(stream," $%u, %s, %s, %s\n",(ulong)(uint)local_cc,pcVar2,plVar1,local_50[0],uVar4
                   ,local_e8.field_2.imm_u32,uVar5);
    goto LAB_00169da8;
  case Imm_Index_Index_Op_3:
    local_cc = (float)local_e8.field_2.imm_u32;
    local_60 = (char *)CONCAT44(local_60._4_4_,local_e8.field_2.imm_u32x2.snd);
    (*source->_vptr_TraceSource[3])(&local_a8,source,3);
    pcVar2 = local_a8.name;
    (*source->_vptr_TraceSource[3])(local_c8,source,2);
    plVar1 = local_c8[0];
    uVar5 = CONCAT44(local_e8.field_2._12_4_,local_e8.field_2._8_4_);
    (*source->_vptr_TraceSource[3])(local_50,source,1);
    Stream::Writef(stream," $%u, $%u, %s, %s, %s\n",(ulong)(uint)local_cc,
                   (ulong)local_60 & 0xffffffff,pcVar2,plVar1,local_50[0],local_e8.field_2.imm_u32,
                   uVar5);
    goto LAB_00169da8;
  case Imm_Index_Index_Op_N:
    pcVar2 = " $%u, $%u\n";
    goto LAB_00169c45;
  case Imm_Index_Offset_Op_1:
    (*source->_vptr_TraceSource[3])(&local_a8,source,1);
    Stream::Writef(stream," $%u:%s+$%u\n",(ulong)local_e8.field_2.imm_u32,local_a8.name,
                   (ulong)local_e8.field_2.imm_u32x2.snd);
    goto LAB_00169f11;
  case Imm_Index_Offset_Op_2:
    local_cc = (float)local_e8.field_2.imm_u32;
    (*source->_vptr_TraceSource[3])(&local_a8,source,2);
    pcVar2 = local_a8.name;
    uVar5 = CONCAT44(local_e8.field_2._12_4_,local_e8.field_2._8_4_);
    uVar3 = CONCAT44(local_e8.kind,local_e8.op.enum_);
    (*source->_vptr_TraceSource[3])(local_c8,source,1);
    format = " $%u:%s+$%u, %s\n";
    goto LAB_001697a1;
  case Imm_Index_Offset_Op_3:
    local_cc = (float)local_e8.field_2.imm_u32;
    (*source->_vptr_TraceSource[3])(&local_a8,source,3);
    local_60 = local_a8.name;
    (*source->_vptr_TraceSource[3])(local_c8,source,2);
    plVar1 = local_c8[0];
    uVar5 = CONCAT44(local_e8.field_2._12_4_,local_e8.field_2._8_4_);
    (*source->_vptr_TraceSource[3])(local_50,source,1);
    Stream::Writef(stream," $%u:%s+$%u, %s, %s\n",(ulong)(uint)local_cc,local_60,
                   (ulong)local_e8.field_2.imm_u32x2.snd,plVar1,local_50[0],local_e8.field_2.imm_u32
                   ,uVar5);
LAB_00169da8:
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    goto LAB_00169ef6;
  case Imm_Index_Offset_Lane_Op_2:
    local_cc = (float)local_e8.field_2.imm_u32;
    (*source->_vptr_TraceSource[3])(&local_a8,source,2);
    pcVar2 = local_a8.name;
    uVar5 = CONCAT44(local_e8.field_2._12_4_,local_e8.field_2._8_4_);
    (*source->_vptr_TraceSource[3])(local_c8,source,1);
    uVar3 = CONCAT44(local_e8.kind,local_e8.field_2._8_4_) & 0xffffffff000000ff;
    format = " $%u:%s+$%u, %s (Lane imm: $%u)\n";
LAB_001697a1:
    Stream::Writef(stream,format,(ulong)(uint)local_cc,pcVar2,(ulong)local_e8.field_2.imm_u32x2.snd,
                   local_c8[0],uVar3,local_e8.field_2.imm_u32,uVar5);
    goto LAB_00169ef6;
  case Imm_I32_Op_0:
    pcVar2 = " %u\n";
LAB_00169c1c:
    Stream::Writef(stream,pcVar2,(ulong)local_e8.field_2.imm_u32);
    break;
  case Imm_I64_Op_0:
    Stream::Writef(stream," %lu\n",CONCAT44(local_e8.field_2.imm_u32x2.snd,local_e8.field_2.imm_u32)
                  );
    break;
  case Imm_F32_Op_0:
    local_e8.field_2.imm_u32 = SUB84((double)(float)local_e8.field_2.imm_f32,0);
    goto LAB_00169e69;
  case Imm_F64_Op_0:
LAB_00169e69:
    Stream::Writef(stream," %g\n",local_e8.field_2.imm_u32);
    break;
  case Imm_I32_I32_Op_0:
    pcVar2 = " $%u $%u\n";
LAB_00169c45:
    Stream::Writef(stream,pcVar2,(ulong)local_e8.field_2.imm_u32,
                   (ulong)local_e8.field_2.imm_u32x2.snd);
    break;
  case Imm_I8_Op_1:
    (*source->_vptr_TraceSource[3])(&local_a8,source,1);
    Stream::Writef(stream," %s : (Lane imm: %u)\n",local_a8.name,(ulong)local_e8.field_2.imm_u8);
    goto LAB_00169f11;
  case Imm_I8_Op_2:
    (*source->_vptr_TraceSource[3])(&local_a8,source,2);
    pcVar2 = local_a8.name;
    (*source->_vptr_TraceSource[3])(local_c8,source,1);
    Stream::Writef(stream," %s, %s : (Lane imm: $%u)\n",pcVar2,local_c8[0],
                   (ulong)local_e8.field_2.imm_u8);
    goto LAB_00169ef6;
  case Imm_V128_Op_0:
    Stream::Writef(stream," i32x4 0x%08x 0x%08x 0x%08x 0x%08x\n",(ulong)local_e8.field_2.imm_u32,
                   (ulong)local_e8.field_2.imm_u32x2.snd,(ulong)(uint)local_e8.field_2._8_4_,
                   (ulong)(uint)local_e8.field_2._12_4_);
    break;
  case Imm_V128_Op_2:
    (*source->_vptr_TraceSource[3])(&local_a8,source,2);
    pcVar2 = local_a8.name;
    uVar5 = CONCAT44(local_e8.field_2._12_4_,local_e8.field_2._8_4_);
    (*source->_vptr_TraceSource[3])(local_c8,source,1);
    Stream::Writef(stream," %s, %s : (Lane imm: i32x4 0x%08x 0x%08x 0x%08x 0x%08x )\n",pcVar2,
                   local_c8[0],(ulong)local_e8.field_2.imm_u32,(ulong)local_e8.field_2.imm_u32x2.snd
                   ,CONCAT44(local_e8.kind,local_e8.field_2._8_4_),local_e8.field_2._12_4_,uVar5);
LAB_00169ef6:
    if (local_c8[0] != local_b8) {
      operator_delete(local_c8[0],local_b8[0] + 1);
    }
LAB_00169f11:
    if ((Type *)local_a8.name != &local_a8.result_type) {
      operator_delete(local_a8.name,(long)local_a8.result_type + 1);
    }
  }
  return local_54;
}

Assistant:

Istream::Offset Istream::Trace(Stream* stream,
                               Offset offset,
                               TraceSource* source) const {
  Offset start = offset;
  Instr instr = Read(&offset);
  stream->Writef("%s| %s", source->Header(start).c_str(), instr.op.GetName());

  switch (instr.kind) {
    case InstrKind::Imm_0_Op_0:
      stream->Writef("\n");
      break;

    case InstrKind::Imm_0_Op_1:
      stream->Writef(" %s\n", source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_0_Op_2:
      stream->Writef(" %s, %s\n", source->Pick(2, instr).c_str(),
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_0_Op_3:
      stream->Writef(" %s, %s, %s\n", source->Pick(3, instr).c_str(),
                     source->Pick(2, instr).c_str(),
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Jump_Op_0:
      stream->Writef(" @%u\n", instr.imm_u32);
      break;

    case InstrKind::Imm_Jump_Op_1:
      stream->Writef(" @%u, %s\n", instr.imm_u32,
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Index_Op_0:
      stream->Writef(" $%u\n", instr.imm_u32);
      break;

    case InstrKind::Imm_Index_Op_1:
      stream->Writef(" $%u, %s\n", instr.imm_u32,
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Index_Op_2:
      stream->Writef(" $%u, %s, %s\n", instr.imm_u32,
                     source->Pick(2, instr).c_str(),
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Index_Op_3:
      stream->Writef(
          " $%u, %s, %s, %s\n", instr.imm_u32, source->Pick(3, instr).c_str(),
          source->Pick(2, instr).c_str(), source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Index_Op_N:
      stream->Writef(" $%u\n", instr.imm_u32);  // TODO param/result count?
      break;

    case InstrKind::Imm_Index_Index_Op_3:
      stream->Writef(" $%u, $%u, %s, %s, %s\n", instr.imm_u32x2.fst,
                     instr.imm_u32x2.snd, source->Pick(3, instr).c_str(),
                     source->Pick(2, instr).c_str(),
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Index_Index_Op_N:
      stream->Writef(" $%u, $%u\n", instr.imm_u32x2.fst,
                     instr.imm_u32x2.snd);  // TODO param/result count?
      break;

    case InstrKind::Imm_Index_Offset_Op_1:
      stream->Writef(" $%u:%s+$%u\n", instr.imm_u32x2.fst,
                     source->Pick(1, instr).c_str(), instr.imm_u32x2.snd);
      break;

    case InstrKind::Imm_Index_Offset_Op_2:
      stream->Writef(" $%u:%s+$%u, %s\n", instr.imm_u32x2.fst,
                     source->Pick(2, instr).c_str(), instr.imm_u32x2.snd,
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Index_Offset_Op_3:
      stream->Writef(" $%u:%s+$%u, %s, %s\n", instr.imm_u32x2.fst,
                     source->Pick(3, instr).c_str(), instr.imm_u32x2.snd,
                     source->Pick(2, instr).c_str(),
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Index_Offset_Lane_Op_2:
      stream->Writef(" $%u:%s+$%u, %s (Lane imm: $%u)\n",
                     instr.imm_u32x2_u8.fst, source->Pick(2, instr).c_str(),
                     instr.imm_u32x2_u8.snd, source->Pick(1, instr).c_str(),
                     instr.imm_u32x2_u8.idx);
      break;

    case InstrKind::Imm_I32_Op_0:
      stream->Writef(" %u\n", instr.imm_u32);
      break;

    case InstrKind::Imm_I64_Op_0:
      stream->Writef(" %" PRIu64 "\n", instr.imm_u64);
      break;

    case InstrKind::Imm_F32_Op_0:
      stream->Writef(" %g\n", instr.imm_f32);
      break;

    case InstrKind::Imm_F64_Op_0:
      stream->Writef(" %g\n", instr.imm_f64);
      break;

    case InstrKind::Imm_I32_I32_Op_0:
      stream->Writef(" $%u $%u\n", instr.imm_u32x2.fst, instr.imm_u32x2.snd);
      break;

    case InstrKind::Imm_I8_Op_1:
      // TODO: cleanup
      stream->Writef(" %s : (Lane imm: %u)\n", source->Pick(1, instr).c_str(),
                     instr.imm_u8);
      break;

    case InstrKind::Imm_I8_Op_2:
      // TODO: cleanup
      stream->Writef(" %s, %s : (Lane imm: $%u)\n",
                     source->Pick(2, instr).c_str(),
                     source->Pick(1, instr).c_str(), instr.imm_u8);
      break;

    case InstrKind::Imm_V128_Op_0:
      stream->Writef(" i32x4 0x%08x 0x%08x 0x%08x 0x%08x\n",
                     instr.imm_v128.u32(0), instr.imm_v128.u32(1),
                     instr.imm_v128.u32(2), instr.imm_v128.u32(3));
      break;

    case InstrKind::Imm_V128_Op_2:
      // TODO: cleanup
      stream->Writef(
          " %s, %s : (Lane imm: i32x4 0x%08x 0x%08x 0x%08x 0x%08x )\n",
          source->Pick(2, instr).c_str(), source->Pick(1, instr).c_str(),
          instr.imm_v128.u32(0), instr.imm_v128.u32(1), instr.imm_v128.u32(2),
          instr.imm_v128.u32(3));
      break;
  }
  return offset;
}